

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

void testing::internal::XmlUnitTestResultPrinter::OutputXmlTestInfo
               (ostream *stream,char *test_case_name,TestInfo *test_info)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  _Alloc_hider _Var2;
  size_t sVar3;
  ostream *poVar4;
  TestPartResult *pTVar5;
  long *plVar6;
  int line;
  size_type *psVar7;
  TimeInMillis ms;
  long lVar8;
  int i;
  size_type sVar9;
  pointer pcVar10;
  char *pcVar11;
  int iVar12;
  string location;
  string message;
  string local_98;
  string local_78;
  string local_58;
  TestResult *local_38;
  
  std::__ostream_insert<char,std::char_traits<char>>(stream,"    <testcase name=\"",0x14);
  EscapeXml((XmlUnitTestResultPrinter *)&local_98,(test_info->name_)._M_dataplus._M_p,true);
  _Var2._M_p = local_98._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    std::ios::clear((int)stream + (int)*(undefined8 *)(*(long *)stream + -0x18));
  }
  else {
    sVar3 = strlen(local_98._M_dataplus._M_p);
    std::__ostream_insert<char,std::char_traits<char>>(stream,_Var2._M_p,sVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>(stream,"\"",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete__(local_98._M_dataplus._M_p);
  }
  pbVar1 = (test_info->value_param_).ptr_;
  if ((pbVar1 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
     ((pbVar1->_M_dataplus)._M_p != (pointer)0x0)) {
    std::__ostream_insert<char,std::char_traits<char>>(stream," value_param=\"",0xe);
    pbVar1 = (test_info->value_param_).ptr_;
    if (pbVar1 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar10 = (char *)0x0;
    }
    else {
      pcVar10 = (pbVar1->_M_dataplus)._M_p;
    }
    EscapeXml((XmlUnitTestResultPrinter *)&local_98,pcVar10,true);
    _Var2._M_p = local_98._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>(stream,"(null)",6);
    }
    else if (local_98._M_string_length != 0) {
      sVar9 = 0;
      do {
        if (_Var2._M_p[sVar9] == '\0') {
          std::__ostream_insert<char,std::char_traits<char>>(stream,"\\0",2);
        }
        else {
          local_58._M_dataplus._M_p._0_1_ = _Var2._M_p[sVar9];
          std::__ostream_insert<char,std::char_traits<char>>(stream,(char *)&local_58,1);
        }
        sVar9 = sVar9 + 1;
      } while (sVar9 != local_98._M_string_length);
    }
    std::__ostream_insert<char,std::char_traits<char>>(stream,"\"",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete__(local_98._M_dataplus._M_p);
    }
  }
  pbVar1 = (test_info->type_param_).ptr_;
  if ((pbVar1 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
     ((pbVar1->_M_dataplus)._M_p != (pointer)0x0)) {
    std::__ostream_insert<char,std::char_traits<char>>(stream," type_param=\"",0xd);
    pbVar1 = (test_info->type_param_).ptr_;
    if (pbVar1 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar10 = (char *)0x0;
    }
    else {
      pcVar10 = (pbVar1->_M_dataplus)._M_p;
    }
    EscapeXml((XmlUnitTestResultPrinter *)&local_98,pcVar10,true);
    _Var2._M_p = local_98._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>(stream,"(null)",6);
    }
    else if (local_98._M_string_length != 0) {
      sVar9 = 0;
      do {
        if (_Var2._M_p[sVar9] == '\0') {
          std::__ostream_insert<char,std::char_traits<char>>(stream,"\\0",2);
        }
        else {
          local_58._M_dataplus._M_p._0_1_ = _Var2._M_p[sVar9];
          std::__ostream_insert<char,std::char_traits<char>>(stream,(char *)&local_58,1);
        }
        sVar9 = sVar9 + 1;
      } while (sVar9 != local_98._M_string_length);
    }
    std::__ostream_insert<char,std::char_traits<char>>(stream,"\"",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete__(local_98._M_dataplus._M_p);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(stream," status=\"",9);
  pcVar11 = "notrun";
  if ((ulong)test_info->should_run_ != 0) {
    pcVar11 = "run";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,pcVar11,((ulong)test_info->should_run_ ^ 1) * 3 + 3);
  std::__ostream_insert<char,std::char_traits<char>>(stream,"\" time=\"",8);
  FormatTimeInMillisAsSeconds_abi_cxx11_
            (&local_98,(internal *)(test_info->result_).elapsed_time_,ms);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (stream,local_98._M_dataplus._M_p,local_98._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\" classname=\"",0xd);
  EscapeXml((XmlUnitTestResultPrinter *)&local_58,test_case_name,true);
  _Var2._M_p = local_58._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
  }
  else {
    sVar3 = strlen(local_58._M_dataplus._M_p);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,_Var2._M_p,sVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\"",1);
  local_38 = &test_info->result_;
  TestPropertiesAsXmlAttributes((XmlUnitTestResultPrinter *)&local_78,local_38);
  _Var2._M_p = local_78._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
  }
  else {
    sVar3 = strlen(local_78._M_dataplus._M_p);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,_Var2._M_p,sVar3);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete__(local_78._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete__(local_58._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if (0 < (int)((ulong)((long)(test_info->result_).test_part_results_.
                              super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(test_info->result_).test_part_results_.
                             super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 6)) {
    i = 0;
    iVar12 = 0;
    do {
      line = (int)test_info;
      pTVar5 = TestResult::GetTestPartResult(local_38,i);
      if (pTVar5->type_ != kSuccess) {
        if (iVar12 == 0) {
          std::__ostream_insert<char,std::char_traits<char>>(stream,">\n",2);
        }
        std::__ostream_insert<char,std::char_traits<char>>(stream,"      <failure message=\"",0x18);
        EscapeXml((XmlUnitTestResultPrinter *)&local_98,(pTVar5->summary_).c_str_,true);
        _Var2._M_p = local_98._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          std::ios::clear((int)stream + (int)*(undefined8 *)(*(long *)stream + -0x18));
        }
        else {
          sVar3 = strlen(local_98._M_dataplus._M_p);
          std::__ostream_insert<char,std::char_traits<char>>(stream,_Var2._M_p,sVar3);
        }
        std::__ostream_insert<char,std::char_traits<char>>(stream,"\" type=\"\">",10);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete__(local_98._M_dataplus._M_p);
        }
        FormatCompilerIndependentFileLocation_abi_cxx11_
                  (&local_98,(internal *)(pTVar5->file_name_).c_str_,
                   (char *)(ulong)(uint)pTVar5->line_number_,line);
        local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_78,local_98._M_dataplus._M_p,
                   local_98._M_dataplus._M_p + local_98._M_string_length);
        std::__cxx11::string::append((char *)&local_78);
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_78);
        psVar7 = (size_type *)(plVar6 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar7) {
          local_58.field_2._M_allocated_capacity = *psVar7;
          local_58.field_2._8_8_ = plVar6[3];
          local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
        }
        else {
          local_58.field_2._M_allocated_capacity = *psVar7;
          local_58._M_dataplus._M_p = (pointer)*plVar6;
        }
        local_58._M_string_length = plVar6[1];
        *plVar6 = (long)psVar7;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
        }
        RemoveInvalidXmlCharacters(&local_78,&local_58);
        OutputXmlCDataSection(stream,local_78._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>(stream,"</failure>\n",0xb);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
        iVar12 = iVar12 + 1;
      }
      i = i + 1;
    } while (i < (int)((ulong)((long)(test_info->result_).test_part_results_.
                                     super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(test_info->result_).test_part_results_.
                                    super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 6));
    if (iVar12 != 0) {
      pcVar11 = "    </testcase>\n";
      lVar8 = 0x10;
      goto LAB_0017e2ca;
    }
  }
  pcVar11 = " />\n";
  lVar8 = 4;
LAB_0017e2ca:
  std::__ostream_insert<char,std::char_traits<char>>(stream,pcVar11,lVar8);
  return;
}

Assistant:

void XmlUnitTestResultPrinter::OutputXmlTestInfo(::std::ostream* stream,
                                                 const char* test_case_name,
                                                 const TestInfo& test_info) {
  const TestResult& result = *test_info.result();
  *stream << "    <testcase name=\""
          << EscapeXmlAttribute(test_info.name()).c_str() << "\"";

  if (test_info.value_param() != NULL) {
    *stream << " value_param=\"" << EscapeXmlAttribute(test_info.value_param())
            << "\"";
  }
  if (test_info.type_param() != NULL) {
    *stream << " type_param=\"" << EscapeXmlAttribute(test_info.type_param())
            << "\"";
  }

  *stream << " status=\""
          << (test_info.should_run() ? "run" : "notrun")
          << "\" time=\""
          << FormatTimeInMillisAsSeconds(result.elapsed_time())
          << "\" classname=\"" << EscapeXmlAttribute(test_case_name).c_str()
          << "\"" << TestPropertiesAsXmlAttributes(result).c_str();

  int failures = 0;
  for (int i = 0; i < result.total_part_count(); ++i) {
    const TestPartResult& part = result.GetTestPartResult(i);
    if (part.failed()) {
      if (++failures == 1)
        *stream << ">\n";
      *stream << "      <failure message=\""
              << EscapeXmlAttribute(part.summary()).c_str()
              << "\" type=\"\">";
      const string location = internal::FormatCompilerIndependentFileLocation(
          part.file_name(), part.line_number());
      const string message = location + "\n" + part.message();
      OutputXmlCDataSection(stream,
                            RemoveInvalidXmlCharacters(message).c_str());
      *stream << "</failure>\n";
    }
  }

  if (failures == 0)
    *stream << " />\n";
  else
    *stream << "    </testcase>\n";
}